

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_hash_element **ppCVar1;
  size_t sVar2;
  void *pvVar3;
  Curl_hash_element *pCVar4;
  
  ppCVar1 = h->table;
  if (ppCVar1 == (Curl_hash_element **)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    pCVar4 = (Curl_hash_element *)(ppCVar1 + sVar2);
    do {
      pCVar4 = pCVar4->next;
      if (pCVar4 == (Curl_hash_element *)0x0) {
        return (void *)0x0;
      }
      sVar2 = (*h->comp_func)(pCVar4->key,pCVar4->key_len,key,key_len);
    } while (sVar2 == 0);
    pvVar3 = pCVar4->ptr;
  }
  return pvVar3;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_hash_element *he;
    DEBUGASSERT(h->slots);
    he = CURL_HASH_SLOT(h, key, key_len);
    while(he) {
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
      he = he->next;
    }
  }
  return NULL;
}